

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O3

Resolver * __thiscall
PoolList<Server::Private::Resolver>::
append<String_const&,unsigned_short,Server::Private::EstablisherImpl&>
          (PoolList<Server::Private::Resolver> *this,String *a,unsigned_short b,EstablisherImpl *c)

{
  Item *pIVar1;
  Item *pIVar2;
  Resolver *this_00;
  PoolList<Server::Private::Resolver> *pPVar3;
  
  this_00 = allocateFreeItem(this);
  Server::Private::Resolver::Resolver(this_00,a,b,c);
  pIVar1 = (this->_end).item;
  pIVar2 = this->freeItem;
  this->freeItem = pIVar2->prev;
  pPVar3 = (PoolList<Server::Private::Resolver> *)pIVar1->prev;
  pIVar2->prev = (Item *)pPVar3;
  if (pPVar3 == (PoolList<Server::Private::Resolver> *)0x0) {
    pPVar3 = this;
  }
  (pPVar3->_begin).item = pIVar2;
  pIVar2->next = pIVar1;
  pIVar1->prev = pIVar2;
  this->_size = this->_size + 1;
  return this_00;
}

Assistant:

T& append(A a, B b, C c) {return linkFreeItem(new (allocateFreeItem()) T(a, b, c));}